

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  char cVar2;
  TRef *pTVar3;
  uint tr;
  IRType IVar4;
  CTypeID CVar5;
  TRef TVar6;
  CTSize sz;
  TRef TVar7;
  GCcdata *cd;
  CType *pCVar8;
  cTValue *pcVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  IRRef1 IVar14;
  int iVar15;
  CTState *cts;
  uint k;
  GCobj *o;
  CType *pCVar16;
  CType *ct;
  uint64_t u64;
  bool bVar17;
  ptrdiff_t ofs;
  CTSize fofs;
  TRef local_74;
  uint64_t local_40;
  int local_38;
  uint local_34;
  
  local_74 = *J->base;
  local_40 = 8;
  cd = argv2cdata(J,local_74,rd->argv);
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pCVar8 = cts->tab;
  pCVar16 = pCVar8 + cd->ctypeid;
  if ((pCVar8[cd->ctypeid].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar16->size;
    if ((~pCVar8[cd->ctypeid].info & 0x20800000) == 0) {
      pCVar16 = pCVar8 + (ushort)pCVar16->info;
    }
    (J->fold).ins.field_0.ot = (ushort)(*pCVar1 == 8) * 4 + 0x4405;
    (J->fold).ins.field_0.op1 = (IRRef1)local_74;
    (J->fold).ins.field_0.op2 = 0xf;
    TVar6 = lj_opt_fold(J);
    local_40 = 0;
    local_74 = crec_reassoc_ofs(J,TVar6,(ptrdiff_t *)&local_40,1);
  }
  do {
    tr = J->base[1];
    pCVar8 = pCVar16;
    if ((tr >> 0x18 & 0x1e) - 0xe < 6) {
      tr = lj_opt_narrow_cindex(J,tr);
      uVar12 = 0;
      if ((pCVar16->info & 0xe0000000) == 0x20000000) {
LAB_0015744c:
        if ((pCVar16->info & 0x4000000) != 0) {
          TVar6 = lj_ir_kint64(J,1);
          (J->fold).ins.field_0.ot = 0x2115;
          (J->fold).ins.field_0.op1 = (IRRef1)tr;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
          tr = lj_opt_fold(J);
        }
        uVar10 = (ushort)pCVar16->info;
        sz = lj_ctype_size(cts,(uint)uVar10);
        TVar6 = crec_reassoc_ofs(J,tr,(ptrdiff_t *)&local_40,sz);
        TVar7 = lj_ir_kint64(J,(ulong)sz);
        (J->fold).ins.field_0.ot = 0x2b15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        tr = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)tr;
        (J->fold).ins.field_0.op2 = (IRRef1)local_74;
        local_74 = lj_opt_fold(J);
        uVar12 = (uint)uVar10;
      }
    }
    else {
      IVar14 = (IRRef1)tr;
      if ((tr & 0x1f000000) == 0x4000000) {
        o = (GCobj *)(ulong)rd->argv[1].u32.lo;
        if ((cd != (GCcdata *)0x0) && (cd->ctypeid == 0x15)) {
          CVar5 = crec_constructor(J,cd,local_74);
          pCVar16 = cts->tab + CVar5;
        }
        if ((pCVar16->info & 0xf0000000) == 0x10000000) {
          pCVar8 = lj_ctype_getfieldq(cts,pCVar16,&o->str,&local_34,(CTInfo *)0x0);
          bVar17 = true;
          if (pCVar8 == (CType *)0x0) {
            uVar12 = 0;
          }
          else {
            u64 = local_34 + local_40;
            local_40 = u64;
            TVar6 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar14;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
            lj_opt_fold(J);
            uVar12 = pCVar8->info;
            if (uVar12 >> 0x1c == 10) {
              if (u64 != 0) {
                TVar6 = lj_ir_kint64(J,u64);
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = (IRRef1)local_74;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                local_74 = lj_opt_fold(J);
              }
              uVar12 = pCVar8->info;
              uVar11 = uVar12 >> 0x10 & 0x7f;
              uVar13 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar13 = (uVar13 ^ 0x1f) * 2 ^ 0x3e;
              (J->fold).ins.field_0.ot =
                   (ushort)((uVar12 & 0x800000) >> 0x17) + (short)uVar13 + 0x450f;
              (J->fold).ins.field_0.op1 = (IRRef1)local_74;
              (J->fold).ins.field_0.op2 = 0;
              TVar6 = lj_opt_fold(J);
              k = uVar12 & 0x7f;
              uVar11 = uVar12 >> 8 & 0x7f;
              IVar14 = (IRRef1)TVar6;
              if (rd->data == 0) {
                if ((uVar12 >> 0x1b & 1) == 0) {
                  if ((uVar12 & 0x800000) == 0) {
                    iVar15 = 0x20 - uVar11;
                    TVar6 = lj_ir_kint(J,iVar15 - k);
                    (J->fold).ins.field_0.ot = 0x2413;
                    (J->fold).ins.field_0.op1 = IVar14;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                    TVar6 = lj_opt_fold(J);
                    TVar7 = lj_ir_kint(J,iVar15);
                    IVar14 = (IRRef1)TVar7;
                    (J->fold).ins.field_0.ot = 0x2613;
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                  }
                  else {
                    TVar6 = lj_ir_kint(J,k);
                    (J->fold).ins.field_0.ot = 0x2513;
                    (J->fold).ins.field_0.op1 = IVar14;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                    TVar6 = lj_opt_fold(J);
                    TVar7 = lj_ir_kint(J,~(-1 << ((byte)(uVar12 >> 8) & 0x1f)));
                    IVar14 = (IRRef1)TVar7;
                    (J->fold).ins.field_0.ot = 0x2113;
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                  }
                  (J->fold).ins.field_0.op2 = IVar14;
                  TVar6 = lj_opt_fold(J);
                }
                else {
                  TVar6 = lj_ir_kint(J,1 << ((byte)k & 0x1f));
                  (J->fold).ins.field_0.ot = 0x2113;
                  (J->fold).ins.field_0.op1 = IVar14;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                  TVar6 = lj_opt_fold(J);
                  TVar7 = lj_ir_kint(J,0);
                  (J->fold).ins.field_0.ot = 0x993;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                  J->postproc = LJ_POST_FIXGUARD;
                  TVar6 = 0x2007ffd;
                }
                *J->base = TVar6;
              }
              else {
                local_38 = ((uVar12 & 0x800000) >> 0x17) + uVar13 + 0xf;
                iVar15 = 10 - (uint)((uVar12 & 0x800000) == 0);
                if ((uVar12 >> 0x1b & 1) != 0) {
                  iVar15 = 3;
                }
                uVar13 = ~(-1 << ((byte)uVar11 & 0x1f)) << ((byte)k & 0x1f);
                TVar6 = crec_ct_tv(J,(CType *)((ulong)(uint)(iVar15 << 4) +
                                              *(long *)(ulong)J[-1].bpropcache[0xc].mode),0,
                                   J->base[2],rd->argv + 2);
                TVar7 = lj_ir_kint(J,uVar12 & 0x7f);
                (J->fold).ins.field_0.ot = 0x2413;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar6 = lj_opt_fold(J);
                uVar10 = (ushort)local_38 | 0x2100;
                TVar7 = lj_ir_kint(J,uVar13);
                (J->fold).ins.field_0.ot = uVar10;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar6 = lj_opt_fold(J);
                TVar7 = lj_ir_kint(J,~uVar13);
                (J->fold).ins.field_0.ot = uVar10;
                (J->fold).ins.field_0.op1 = IVar14;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar7 = lj_opt_fold(J);
                uVar10 = (ushort)local_38;
                (J->fold).ins.field_0.ot = uVar10 | 0x2200;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                TVar6 = lj_opt_fold(J);
                (J->fold).ins.field_0.ot = uVar10 | 0x4c00;
                (J->fold).ins.field_0.op1 = (IRRef1)local_74;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
                lj_opt_fold(J);
                rd->nres = 0;
                J->needsnap = '\x01';
              }
              bVar17 = false;
              uVar12 = 0;
            }
            else if (uVar12 >> 0x1c == 0xb) {
              uVar13 = pCVar8->size;
              if (((int)uVar13 < 0) &&
                 ((*(byte *)((long)&cts->tab->info + (ulong)((uVar12 & 0xffff) << 4) + 2) & 0x80) !=
                  0)) {
                TVar6 = lj_ir_knum_u64(J,(uint64_t)(double)uVar13);
              }
              else {
                TVar6 = lj_ir_kint(J,uVar13);
              }
              *J->base = TVar6;
              uVar12 = 0;
              bVar17 = false;
            }
            else {
              uVar12 = uVar12 & 0xffff;
              bVar17 = true;
            }
          }
        }
        else {
          bVar17 = true;
          uVar12 = 0;
          if (((pCVar16->info & 0xf4000000) == 0x34000000) && ((o->str).len == 2)) {
            cVar2 = (char)(o->gch).metatable.gcptr32;
            if (cVar2 == 'i') {
              if (*(char *)((long)&(o->gch).metatable.gcptr32 + 1) == 'm') goto LAB_00157320;
            }
            else if ((cVar2 == 'r') && (*(char *)((long)&(o->gch).metatable.gcptr32 + 1) == 'e')) {
LAB_00157320:
              TVar6 = lj_ir_kgc(J,o,IRT_STR);
              (J->fold).ins.field_0.ot = 0x884;
              (J->fold).ins.field_0.op1 = IVar14;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
              lj_opt_fold(J);
              if ((char)(o->gch).metatable.gcptr32 == 'i') {
                local_40 = local_40 + (pCVar16->size >> 1);
              }
              uVar12 = (uint)(ushort)pCVar16->info;
              bVar17 = true;
            }
          }
        }
        pCVar8 = pCVar16;
        if (!bVar17) {
          return;
        }
      }
      else {
        uVar12 = 0;
        if ((tr & 0x1f000000) == 0xa000000) {
          ct = cts->tab + *(ushort *)((ulong)rd->argv[1].u32.lo + 6);
          IVar4 = crec_ct2irt(cts,ct);
          bVar17 = (pCVar16->info & 0xe0000000) == 0x20000000;
          if (IRT_NUM < IVar4 && bVar17) {
            uVar10 = (ushort)IVar4;
            if (ct->size == 4) {
              (J->fold).ins.field_0.ot = uVar10 | 0x4400;
              (J->fold).ins.field_0.op1 = IVar14;
              (J->fold).ins.field_0.op2 = 0x10;
            }
            else if (ct->size == 8) {
              (J->fold).ins.field_0.ot = uVar10 | 0x4400;
              (J->fold).ins.field_0.op1 = IVar14;
              (J->fold).ins.field_0.op2 = 0x11;
            }
            else {
              TVar6 = lj_ir_kint64(J,8);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = IVar14;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
              TVar6 = lj_opt_fold(J);
              (J->fold).ins.field_0.ot = uVar10 | 0x4500;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
              (J->fold).ins.field_0.op2 = 0;
            }
            tr = lj_opt_fold(J);
            if ((ct->size < 8) && ((ct->info & 0x800000) == 0)) {
              (J->fold).ins.field_0.op1 = (IRRef1)tr;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x59150ab3;
              tr = lj_opt_fold(J);
            }
          }
          uVar12 = 0;
          if (IRT_NUM < IVar4 && bVar17) goto LAB_0015744c;
        }
      }
    }
    if (uVar12 != 0) {
      if (local_40 != 0) {
        TVar6 = lj_ir_kint64(J,local_40);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)local_74;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        local_74 = lj_opt_fold(J);
      }
      pCVar16 = (CType *)((long)&cts->tab->info + (ulong)(uVar12 << 4));
      if ((*(uint *)((long)&cts->tab->info + (ulong)(uVar12 << 4)) & 0xf0800000) == 0x20800000) {
        (J->fold).ins.field_0.op1 = (IRRef1)local_74;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090000;
        local_74 = lj_opt_fold(J);
        uVar10 = (ushort)pCVar16->info;
        uVar12 = (uint)uVar10;
        pCVar16 = cts->tab + uVar10;
      }
      if (rd->data != 0) {
        rd->nres = 0;
        J->needsnap = '\x01';
        crec_ct_tv(J,pCVar16,local_74,J->base[2],rd->argv + 2);
        return;
      }
      TVar6 = crec_tv_ct(J,pCVar16,uVar12,local_74);
      *J->base = TVar6;
      return;
    }
    if ((((pCVar8->info & 0xf0000000) != 0x20000000) ||
        (uVar10 = (ushort)pCVar8->info, pCVar16 = cts->tab + uVar10,
        (cts->tab[uVar10].info & 0xf0000000) != 0x10000000)) ||
       (cd = (GCcdata *)0x0, pCVar8 = pCVar16, (tr & 0x1f000000) != 0x4000000)) {
      pcVar9 = lj_ctype_meta(cts,(CTypeID)((ulong)((long)pCVar8 - (long)cts->tab) >> 4),
                             (uint)(rd->data != 0));
      if (pcVar9 != (cTValue *)0x0) {
        if ((pcVar9->field_2).it == 0xfffffff7) {
          TVar6 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar9->u32).lo,IRT_FUNC);
          J->base[-1] = TVar6 | 0x10000;
          rd->nres = -1;
          return;
        }
        if ((((pcVar9->field_2).it == 0xfffffff4) && (rd->data == 0)) &&
           ((J->base[1] & 0x1f000000) == 0x4000000)) {
          pcVar9 = lj_tab_get(J->L,(GCtab *)(ulong)(pcVar9->u32).lo,rd->argv + 1);
          TVar6 = lj_record_constify(J,pcVar9);
          pTVar3 = J->base;
          *pTVar3 = TVar6;
          if (TVar6 != 0) {
            TVar6 = pTVar3[1];
            TVar7 = lj_ir_kgc(J,(GCobj *)(ulong)rd->argv[1].u32.lo,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            lj_opt_fold(J);
            return;
          }
        }
      }
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}